

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ios_prop.h
# Opt level: O0

propery * booster::locale::impl::ios_prop<propery>::get(ios_base *ios)

{
  bool bVar1;
  int iVar2;
  void **ppvVar3;
  ios_base *in_stack_00000008;
  propery *in_stack_00000010;
  int id;
  ios_base *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffec;
  propery in_stack_fffffffffffffff0;
  
  iVar2 = get_id();
  bVar1 = has(in_stack_ffffffffffffffd8);
  if (!bVar1) {
    propery::propery((propery *)&stack0xfffffffffffffff0,-1);
    set(in_stack_00000010,in_stack_00000008);
    propery::~propery((propery *)&stack0xfffffffffffffff0);
  }
  ppvVar3 = std::ios_base::pword
                      ((ios_base *)CONCAT44(iVar2,in_stack_fffffffffffffff0.x),
                       in_stack_ffffffffffffffec);
  return (propery *)*ppvVar3;
}

Assistant:

static Property &get(std::ios_base &ios)
                {
                    int id=get_id();
                    if(!has(ios))
                        set(Property(),ios);
                    return *static_cast<Property *>(ios.pword(id));
                }